

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderUInt32
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  uint32 uVar3;
  uint32 local_34 [2];
  uint32 buffer32;
  
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar3 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00335157;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar3 = 0;
LAB_00335157:
    uVar3 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar3);
  }
  pCVar1->last_tag_ = uVar3;
  local_34[0] = 0;
  if (uVar3 == 0) goto LAB_003351ad;
  io::CodedInputStream::ReadVarint32(this->stream_,local_34);
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar3 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_0033519c;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar3 = 0;
LAB_0033519c:
    uVar3 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar3);
  }
  pCVar1->last_tag_ = uVar3;
LAB_003351ad:
  (**(code **)(*(long *)field_name.length_ + 0x40))
            ((long *)field_name.length_,type,field_name.ptr_,local_34[0]);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderUInt32(const ProtoStreamObjectSource* os,
                                             const google::protobuf::Type& type,
                                             StringPiece field_name,
                                             ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint32 buffer32 = 0;  // default value of UInt32 wrapper value
  if (tag != 0) {
    os->stream_->ReadVarint32(&buffer32);
    os->stream_->ReadTag();
  }
  ow->RenderUint32(field_name, bit_cast<uint32>(buffer32));
  return util::Status();
}